

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

ComponentPtr __thiscall libcellml::AnyCellmlElement::component(AnyCellmlElement *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  shared_ptr<libcellml::Component> sVar2;
  ComponentPtr CVar3;
  bad_any_cast *anon_var_0;
  AnyCellmlElement *this_local;
  
  if ((*(int *)*in_RSI == 0) || (*(int *)*in_RSI == 1)) {
    sVar2 = std::any_cast<std::shared_ptr<libcellml::Component>>((any *)this);
    _Var1 = sVar2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  }
  else {
    std::shared_ptr<libcellml::Component>::shared_ptr
              ((shared_ptr<libcellml::Component> *)this,(nullptr_t)0x0);
    _Var1._M_pi = extraout_RDX;
  }
  CVar3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  CVar3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ComponentPtr)CVar3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr AnyCellmlElement::component() const
{
    if ((mPimpl->mType == CellmlElementType::COMPONENT)
        || (mPimpl->mType == CellmlElementType::COMPONENT_REF)) {
        try {
            return std::any_cast<ComponentPtr>(mPimpl->mItem);
        } catch (const std::bad_any_cast &) {
            return nullptr;
        }
    }

    return nullptr;
}